

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA5Application.cpp
# Opt level: O1

void __thiscall
PA5Application::RenderObjectPart::draw
          (RenderObjectPart *this,Sampler *colormap,Sampler *normalmap,Sampler *specularmap)

{
  (**(((this->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_OGLStateObject)._vptr_OGLStateObject)();
  Sampler::attachTexture
            (colormap,(this->m_diffuseTexture).
                      super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  Sampler::attachTexture
            (normalmap,
             (this->m_normalTexture).super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  Sampler::attachTexture
            (specularmap,
             (this->m_specularTexture).super___shared_ptr<Texture,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  VAO::draw((this->m_vao).super___shared_ptr<VAO,_(__gnu_cxx::_Lock_policy)2>._M_ptr,4);
  (*(((this->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_OGLStateObject)._vptr_OGLStateObject[1])();
  return;
}

Assistant:

void PA5Application::RenderObjectPart::draw(Sampler * colormap, Sampler * normalmap, Sampler * specularmap)
{
  m_program->bind();
  colormap->attachTexture(*m_diffuseTexture);
  normalmap->attachTexture(*m_normalTexture);
  specularmap->attachTexture(*m_specularTexture);
  m_vao->draw();
  m_program->unbind();
}